

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::readDisplayBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          GLEngine *this)

{
  GLint viewport [4];
  allocator_type local_29;
  GLint local_28 [2];
  int local_20;
  int local_1c;
  
  (*glad_glFlush)();
  (*glad_glFinish)();
  (*glad_glGetIntegerv)(0xba2,local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)(local_20 * local_1c * 4),&local_29);
  (*glad_glReadPixels)
            (0,0,local_20,local_1c,0x1908,0x1401,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> GLEngine::readDisplayBuffer() {

  // TODO do we need to bind here?

  glFlush();
  glFinish();

  // Get buffer size
  GLint viewport[4];
  glGetIntegerv(GL_VIEWPORT, viewport);
  int w = viewport[2];
  int h = viewport[3];

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize);
  glReadPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &(buff.front()));

  return buff;
}